

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestProgramStart(StreamingListener *this,UnitTest *param_2)

{
  string *in_RDI;
  StreamingListener *this_00;
  undefined1 local_31 [49];
  
  this_00 = (StreamingListener *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_31 + 1),"event=TestProgramStart",(allocator *)this_00);
  SendLn(this_00,in_RDI);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  return;
}

Assistant:

void OnTestProgramStart(const UnitTest& /* unit_test */) {
    SendLn("event=TestProgramStart");
  }